

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __cxxabiv1::anon_unknown_0::parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                 (char *first,char *last,Db *db)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  pointer psVar4;
  char *pcVar5;
  char *pcVar6;
  value_type local_68;
  
  if ((long)last - (long)first < 2) {
    return first;
  }
  pcVar6 = first;
  switch(*first) {
  case 'a':
    bVar1 = first[1];
    if (bVar1 < 0x61) {
      if (bVar1 == 0x4e) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d26;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x53) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d;
        local_68.first._M_string_length = 9;
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else if ((bVar1 == 0x6e) || (bVar1 == 100)) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x26;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (bVar1 != 0x61) {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2626;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  default:
    goto switchD_001ac1f0_caseD_62;
  case 'c':
    bVar1 = first[1];
    if (bVar1 < 0x6f) {
      if (bVar1 == 0x6c) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x2928;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x6d) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x2c;
        local_68.first._M_string_length = 9;
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else {
      if (bVar1 != 0x6f) {
        if (bVar1 != 0x76) {
          return first;
        }
        bVar3 = db->try_to_parse_template_args;
        db->try_to_parse_template_args = false;
        pcVar5 = parse_type<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
        db->try_to_parse_template_args = bVar3;
        bVar3 = true;
        if (pcVar5 == first + 2) goto LAB_001ace7d;
        psVar4 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((db->names).
            super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ._M_impl.super__Vector_impl_data._M_start != psVar4) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::insert(&psVar4[-1].first,0,"operator ");
          db->parsed_ctor_dtor_cv = true;
          pcVar6 = pcVar5;
          goto LAB_001ace7d;
        }
        goto LAB_001ace78;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x7e;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'd':
    bVar1 = first[1];
    if (bVar1 < 0x65) {
      if (bVar1 == 0x56) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d2f;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x61) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        std::__cxx11::
        basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                    *)&local_68,"operator delete[]","");
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else if (bVar1 == 0x65) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2a;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else if (bVar1 == 0x6c) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x6420;
      local_68.first.field_2._M_local_buf[10] = 'e';
      local_68.first.field_2._M_local_buf[0xb] = 'l';
      local_68.first.field_2._M_local_buf[0xc] = 'e';
      local_68.first.field_2._M_local_buf[0xd] = 't';
      local_68.first.field_2._M_local_buf[0xe] = 'e';
      local_68.first._M_string_length = 0xf;
      local_68.first.field_2._M_local_buf[0xf] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (bVar1 != 0x76) {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2f;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'e':
    cVar2 = first[1];
    if (cVar2 == 'O') {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3d5e;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else if (cVar2 == 'q') {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3d3d;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (cVar2 != 'o') {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x5e;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'g':
    if (first[1] == 't') {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3e;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (first[1] != 'e') {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3d3e;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'i':
    if (first[1] != 'x') {
      return first;
    }
    local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
    local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
    local_68.first.field_2._M_local_buf[6] = 'o';
    local_68.first.field_2._M_local_buf[7] = 'r';
    local_68.first.field_2._8_2_ = 0x5d5b;
    local_68.first._M_string_length = 10;
    local_68.first.field_2._M_local_buf[10] = '\0';
    local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
    local_68.second._M_string_length = 0;
    local_68.second.field_2._M_local_buf[0] = '\0';
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_68);
    break;
  case 'l':
    bVar1 = first[1];
    if (bVar1 < 0x69) {
      if (bVar1 == 0x53) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3c3c;
        local_68.first.field_2._M_local_buf[10] = '=';
        local_68.first._M_string_length = 0xb;
        local_68.first.field_2._M_local_buf[0xb] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x65) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d3c;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else {
      if (bVar1 == 0x69) {
        pcVar5 = parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
        bVar3 = true;
        if (pcVar5 == first + 2) goto LAB_001ace7d;
        psVar4 = (db->names).
                 super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((db->names).
            super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
            ._M_impl.super__Vector_impl_data._M_start != psVar4) {
          pcVar6 = "operator\"\" ";
          goto LAB_001ace6f;
        }
        goto LAB_001ace78;
      }
      if (bVar1 == 0x73) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3c3c;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x74) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3c;
        local_68.first._M_string_length = 9;
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    break;
  case 'm':
    bVar1 = first[1];
    if (bVar1 < 0x69) {
      if (bVar1 == 0x49) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d2d;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x4c) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d2a;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else if (bVar1 == 0x6d) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2d2d;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else if (bVar1 == 0x6c) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2a;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (bVar1 != 0x69) {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2d;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'n':
    bVar1 = first[1];
    if (bVar1 < 0x67) {
      if (bVar1 == 0x61) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x6e20;
        local_68.first.field_2._M_local_buf[10] = 'e';
        local_68.first.field_2._M_local_buf[0xb] = 'w';
        local_68.first.field_2._M_local_buf[0xc] = '[';
        local_68.first.field_2._M_local_buf[0xd] = ']';
        local_68.first._M_string_length = 0xe;
        local_68.first.field_2._M_local_buf[0xe] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x65) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d21;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else if (bVar1 == 0x67) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2d;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else if (bVar1 == 0x74) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x21;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (bVar1 != 0x77) {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x6e20;
      local_68.first.field_2._M_local_buf[10] = 'e';
      local_68.first.field_2._M_local_buf[0xb] = 'w';
      local_68.first._M_string_length = 0xc;
      local_68.first.field_2._M_local_buf[0xc] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'o':
    cVar2 = first[1];
    if (cVar2 == 'R') {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3d7c;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else if (cVar2 == 'r') {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x7c;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (cVar2 != 'o') {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x7c7c;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'p':
    switch(first[1]) {
    case 'l':
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2b;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
      break;
    case 'm':
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3e2d;
      local_68.first.field_2._M_local_buf[10] = '*';
      local_68.first._M_string_length = 0xb;
      local_68.first.field_2._M_local_buf[0xb] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
      break;
    case 'n':
    case 'o':
    case 'q':
    case 'r':
      goto switchD_001ac1f0_caseD_62;
    case 'p':
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2b2b;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
      break;
    case 's':
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x2b;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
      break;
    case 't':
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3e2d;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
      break;
    default:
      if (first[1] != 'L') {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3d2b;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'q':
    if (first[1] != 'u') {
      return first;
    }
    local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
    local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
    local_68.first.field_2._M_local_buf[6] = 'o';
    local_68.first.field_2._M_local_buf[7] = 'r';
    local_68.first.field_2._8_2_ = 0x3f;
    local_68.first._M_string_length = 9;
    local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
    local_68.second._M_string_length = 0;
    local_68.second.field_2._M_local_buf[0] = '\0';
    std::
    vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
    ::push_back(&db->names,&local_68);
    break;
  case 'r':
    bVar1 = first[1];
    if (bVar1 < 0x6d) {
      if (bVar1 == 0x4d) {
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3d25;
        local_68.first._M_string_length = 10;
        local_68.first.field_2._M_local_buf[10] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
      else {
        if (bVar1 != 0x53) {
          return first;
        }
        local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
        local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
        local_68.first.field_2._M_local_buf[6] = 'o';
        local_68.first.field_2._M_local_buf[7] = 'r';
        local_68.first.field_2._8_2_ = 0x3e3e;
        local_68.first.field_2._M_local_buf[10] = '=';
        local_68.first._M_string_length = 0xb;
        local_68.first.field_2._M_local_buf[0xb] = '\0';
        local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
        local_68.second._M_string_length = 0;
        local_68.second.field_2._M_local_buf[0] = '\0';
        std::
        vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ::push_back(&db->names,&local_68);
      }
    }
    else if (bVar1 == 0x73) {
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x3e3e;
      local_68.first._M_string_length = 10;
      local_68.first.field_2._M_local_buf[10] = '\0';
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    else {
      if (bVar1 != 0x6d) {
        return first;
      }
      local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
      local_68.first.field_2._M_allocated_capacity._0_6_ = 0x74617265706f;
      local_68.first.field_2._M_local_buf[6] = 'o';
      local_68.first.field_2._M_local_buf[7] = 'r';
      local_68.first.field_2._8_2_ = 0x25;
      local_68.first._M_string_length = 9;
      local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
      local_68.second._M_string_length = 0;
      local_68.second.field_2._M_local_buf[0] = '\0';
      std::
      vector<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
      ::push_back(&db->names,&local_68);
    }
    break;
  case 'v':
    if (9 < (int)first[1] - 0x30U) {
      return first;
    }
    pcVar5 = parse_source_name<__cxxabiv1::(anonymous_namespace)::Db>(first + 2,last,db);
    bVar3 = true;
    if (pcVar5 == first + 2) goto LAB_001ace7d;
    psVar4 = (db->names).
             super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((db->names).
        super__Vector_base<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,___cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar4) {
      pcVar6 = "operator ";
LAB_001ace6f:
      bVar3 = true;
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::insert(&psVar4[-1].first,0,pcVar6);
      pcVar6 = pcVar5;
      goto LAB_001ace7d;
    }
LAB_001ace78:
    bVar3 = false;
LAB_001ace7d:
    if (!bVar3) {
      return first;
    }
    return pcVar6;
  }
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  ::~string_pair(&local_68);
  first = first + 2;
switchD_001ac1f0_caseD_62:
  return first;
}

Assistant:

const char*
parse_operator_name(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        switch (first[0])
        {
        case 'a':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator&&");
                first += 2;
                break;
            case 'd':
            case 'n':
                db.names.push_back("operator&");
                first += 2;
                break;
            case 'N':
                db.names.push_back("operator&=");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator=");
                first += 2;
                break;
            }
            break;
        case 'c':
            switch (first[1])
            {
            case 'l':
                db.names.push_back("operator()");
                first += 2;
                break;
            case 'm':
                db.names.push_back("operator,");
                first += 2;
                break;
            case 'o':
                db.names.push_back("operator~");
                first += 2;
                break;
            case 'v':
                {
                    bool try_to_parse_template_args = db.try_to_parse_template_args;
                    db.try_to_parse_template_args = false;
                    const char* t = parse_type(first+2, last, db);
                    db.try_to_parse_template_args = try_to_parse_template_args;
                    if (t != first+2)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.insert(0, "operator ");
                        db.parsed_ctor_dtor_cv = true;
                        first = t;
                    }
                }
                break;
            }
            break;
        case 'd':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator delete[]");
                first += 2;
                break;
            case 'e':
                db.names.push_back("operator*");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator delete");
                first += 2;
                break;
            case 'v':
                db.names.push_back("operator/");
                first += 2;
                break;
            case 'V':
                db.names.push_back("operator/=");
                first += 2;
                break;
            }
            break;
        case 'e':
            switch (first[1])
            {
            case 'o':
                db.names.push_back("operator^");
                first += 2;
                break;
            case 'O':
                db.names.push_back("operator^=");
                first += 2;
                break;
            case 'q':
                db.names.push_back("operator==");
                first += 2;
                break;
            }
            break;
        case 'g':
            switch (first[1])
            {
            case 'e':
                db.names.push_back("operator>=");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator>");
                first += 2;
                break;
            }
            break;
        case 'i':
            if (first[1] == 'x')
            {
                db.names.push_back("operator[]");
                first += 2;
            }
            break;
        case 'l':
            switch (first[1])
            {
            case 'e':
                db.names.push_back("operator<=");
                first += 2;
                break;
            case 'i':
                {
                    const char* t = parse_source_name(first+2, last, db);
                    if (t != first+2)
                    {
                        if (db.names.empty())
                            return first;
                        db.names.back().first.insert(0, "operator\"\" ");
                        first = t;
                    }
                }
                break;
            case 's':
                db.names.push_back("operator<<");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator<<=");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator<");
                first += 2;
                break;
            }
            break;
        case 'm':
            switch (first[1])
            {
            case 'i':
                db.names.push_back("operator-");
                first += 2;
                break;
            case 'I':
                db.names.push_back("operator-=");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator*");
                first += 2;
                break;
            case 'L':
                db.names.push_back("operator*=");
                first += 2;
                break;
            case 'm':
                db.names.push_back("operator--");
                first += 2;
                break;
            }
            break;
        case 'n':
            switch (first[1])
            {
            case 'a':
                db.names.push_back("operator new[]");
                first += 2;
                break;
            case 'e':
                db.names.push_back("operator!=");
                first += 2;
                break;
            case 'g':
                db.names.push_back("operator-");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator!");
                first += 2;
                break;
            case 'w':
                db.names.push_back("operator new");
                first += 2;
                break;
            }
            break;
        case 'o':
            switch (first[1])
            {
            case 'o':
                db.names.push_back("operator||");
                first += 2;
                break;
            case 'r':
                db.names.push_back("operator|");
                first += 2;
                break;
            case 'R':
                db.names.push_back("operator|=");
                first += 2;
                break;
            }
            break;
        case 'p':
            switch (first[1])
            {
            case 'm':
                db.names.push_back("operator->*");
                first += 2;
                break;
            case 'l':
                db.names.push_back("operator+");
                first += 2;
                break;
            case 'L':
                db.names.push_back("operator+=");
                first += 2;
                break;
            case 'p':
                db.names.push_back("operator++");
                first += 2;
                break;
            case 's':
                db.names.push_back("operator+");
                first += 2;
                break;
            case 't':
                db.names.push_back("operator->");
                first += 2;
                break;
            }
            break;
        case 'q':
            if (first[1] == 'u')
            {
                db.names.push_back("operator?");
                first += 2;
            }
            break;
        case 'r':
            switch (first[1])
            {
            case 'm':
                db.names.push_back("operator%");
                first += 2;
                break;
            case 'M':
                db.names.push_back("operator%=");
                first += 2;
                break;
            case 's':
                db.names.push_back("operator>>");
                first += 2;
                break;
            case 'S':
                db.names.push_back("operator>>=");
                first += 2;
                break;
            }
            break;
        case 'v':
            if (std::isdigit(first[1]))
            {
                const char* t = parse_source_name(first+2, last, db);
                if (t != first+2)
                {
                    if (db.names.empty())
                        return first;
                    db.names.back().first.insert(0, "operator ");
                    first = t;
                }
            }
            break;
        }
    }
    return first;
}